

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_affinity(void)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  char *pcVar5;
  uv_loop_t *puVar6;
  undefined8 uVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  int64_t eval_b;
  char cpustr [11];
  int64_t eval_b_2;
  cpu_set_t cpuset;
  
  uVar1 = uv_cpumask_size();
  if ((int)uVar1 < 1) {
    pcVar5 = "cpumask_size > 0";
    uVar7 = 0x652;
LAB_00177f53:
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,uVar7,pcVar5);
    abort();
  }
  cpuset.__bits[0xe] = 0;
  cpuset.__bits[0xf] = 0;
  cpuset.__bits[0xc] = 0;
  cpuset.__bits[0xd] = 0;
  cpuset.__bits[10] = 0;
  cpuset.__bits[0xb] = 0;
  cpuset.__bits[8] = 0;
  cpuset.__bits[9] = 0;
  cpuset.__bits[6] = 0;
  cpuset.__bits[7] = 0;
  cpuset.__bits[4] = 0;
  cpuset.__bits[5] = 0;
  cpuset.__bits[2] = 0;
  cpuset.__bits[3] = 0;
  cpuset.__bits[0] = 0;
  cpuset.__bits[1] = 0;
  uVar9 = 0;
  iVar2 = sched_getaffinity(0,0x80,(cpu_set_t *)&cpuset);
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    uVar9 = (ulong)*piVar3;
  }
  eval_b = 0;
  if (uVar9 == 0) {
    eval_b = (int64_t)uVar1;
    for (uVar4 = 0;
        (uVar9 = eval_b, eval_b != uVar4 &&
        ((0x3ff < uVar4 || (uVar9 = uVar4, (cpuset.__bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0)))
        ); uVar4 = uVar4 + 1) {
    }
    uVar9 = uVar9 & 0xffffffff;
    cpustr._0_8_ = uVar9;
    if (uVar9 < (ulong)eval_b) {
      snprintf(cpustr,0xb,"%d",uVar9);
      init_process_options("spawn_helper_affinity",exit_cb);
      pcVar5 = (char *)calloc(eval_b,1);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "newmask != NULL";
        uVar7 = 0x679;
      }
      else {
        pcVar5[uVar9] = '\x01';
        options.cpumask = pcVar5;
        options.cpumask_size = eval_b;
        options.args[2] = cpustr;
        options.args[3] = "dummy";
        puVar6 = uv_default_loop();
        iVar2 = uv_spawn(puVar6,&process,&options);
        if (iVar2 == 0) {
          puVar6 = uv_default_loop();
          iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
          if (iVar2 == 0) {
            if (exit_cb_called == 1) {
              if (close_cb_called == 1) {
                free(pcVar5);
                puVar6 = uv_default_loop();
                close_loop(puVar6);
                puVar6 = uv_default_loop();
                iVar2 = uv_loop_close(puVar6);
                eval_b = (int64_t)iVar2;
                if (eval_b == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar8 = "uv_loop_close(uv_default_loop())";
                pcVar5 = "0";
                uVar7 = 0x68d;
                pcVar10 = "==";
                uVar9 = 0;
                goto LAB_00177f9d;
              }
              pcVar5 = "close_cb_called == 1";
              uVar7 = 0x689;
            }
            else {
              pcVar5 = "exit_cb_called == 1";
              uVar7 = 0x688;
            }
          }
          else {
            pcVar5 = "r == 0";
            uVar7 = 0x686;
          }
        }
        else {
          pcVar5 = "r == 0";
          uVar7 = 0x683;
        }
      }
      goto LAB_00177f53;
    }
    pcVar10 = "<";
    pcVar8 = "cpumask_size";
    pcVar5 = "cpu";
    uVar7 = 0x672;
  }
  else {
    pcVar10 = "==";
    pcVar8 = "0";
    pcVar5 = "r";
    uVar7 = 0x66a;
    cpustr._0_8_ = uVar9;
  }
LAB_00177f9d:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar7,pcVar5,pcVar10,pcVar8,uVar9,pcVar10,eval_b);
  abort();
}

Assistant:

TEST_IMPL(spawn_affinity) {
#if defined(NO_CPU_AFFINITY)
  RETURN_SKIP(NO_CPU_AFFINITY);
#else
  int i;
  int r;
  int cpu;
  char cpustr[11];
  char* newmask;
  int cpumask_size;
#if defined(_WIN32)
  DWORD_PTR procmask;
  DWORD_PTR sysmask;
#elif defined(__linux__)
  cpu_set_t cpuset;
#else
  cpuset_t cpuset;
#endif

  cpumask_size = uv_cpumask_size();
  ASSERT(cpumask_size > 0);

  /* find a cpu we can use */
  cpu = cpumask_size;
#ifdef _WIN32
  r = GetProcessAffinityMask(GetCurrentProcess(), &procmask, &sysmask);
  ASSERT_NE(r, 0);
  for (i = 0; i < cpumask_size; ++i) {
    if (procmask & (((DWORD_PTR)1) << i)) {
      cpu = i;
      break;
    }
  }
#else
  CPU_ZERO(&cpuset);
#ifdef __linux__
  r = sched_getaffinity(0, sizeof(cpuset), &cpuset);
  if (r)
    r = errno;
  else
    r = 0;
#else
  r = pthread_getaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
#endif
  ASSERT_EQ(r, 0);
  for (i = 0; i < cpumask_size; ++i) {
    if (CPU_ISSET(i, &cpuset)) {
      cpu = i;
      break;
    }
  }
#endif
  ASSERT_LT(cpu, cpumask_size);
  snprintf(cpustr, sizeof(cpustr), "%d", cpu);

  init_process_options("spawn_helper_affinity", exit_cb);

  /* mask the child to just one cpu */
  newmask = (char*)calloc(cpumask_size, 1);
  ASSERT(newmask != NULL);
  newmask[cpu] = 1;
  options.cpumask_size = (size_t)cpumask_size;
  options.cpumask = newmask;

  /* tell the child which one it should get */
  options.args[2] = cpustr;
  options.args[3] = "dummy"; /* need 4 args for test/run-tests.c dispatch */

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  free(newmask);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#endif
}